

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::DefaultsTest::testActive(DefaultsTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  GLint is_active;
  GLint local_194;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  local_194 = -1;
  (*this->m_gl_getTransformFeedbackiv)(this->m_xfb_dsa,0x8e24,&local_194);
  if (local_194 == 0) {
    bVar1 = true;
  }
  else {
    if (local_194 == -1) {
      local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_190 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_190 + 8),
                 "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE has not returned anything and error has not been generated."
                 ,0x80);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_190._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_190 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE has returned "
                 ,0x52);
      std::ostream::operator<<(this_00,local_194);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,", however FALSE is expected.",0x1c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
    std::ios_base::~ios_base(local_118);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DefaultsTest::testActive()
{
	/* Check that it is not active. */
	glw::GLint is_active = -1;
	m_gl_getTransformFeedbackiv(m_xfb_dsa, GL_TRANSFORM_FEEDBACK_ACTIVE, &is_active);

	if (-1 == is_active)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE "
											   "has not returned anything and error has not been generated."
											<< tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		if (0 != is_active)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetTransformFeedbackiv with parameter GL_TRANSFORM_FEEDBACK_ACTIVE has returned " << is_active
				<< ", however FALSE is expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}